

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O0

void testrand_seed(uchar *seed16)

{
  int j;
  uint64_t s;
  int i;
  secp256k1_sha256 hash;
  uchar out32 [32];
  int local_a4;
  size_t in_stack_ffffffffffffff60;
  ulong uVar1;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar2;
  secp256k1_sha256 *in_stack_ffffffffffffff70;
  byte local_28 [40];
  
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff70);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff70,
             (uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff70,
             (uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  secp256k1_sha256_finalize
            (in_stack_ffffffffffffff70,
             (uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    uVar1 = 0;
    for (local_a4 = 0; local_a4 < 8; local_a4 = local_a4 + 1) {
      uVar1 = uVar1 << 8 | (ulong)local_28[iVar2 * 8 + local_a4];
    }
    secp256k1_test_state[iVar2] = uVar1;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void testrand_seed(const unsigned char *seed16) {
    static const unsigned char PREFIX[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', ' ', 't', 'e', 's', 't', ' ', 'i', 'n', 'i', 't'};
    unsigned char out32[32];
    secp256k1_sha256 hash;
    int i;

    /* Use SHA256(PREFIX || seed16) as initial state. */
    secp256k1_sha256_initialize(&hash);
    secp256k1_sha256_write(&hash, PREFIX, sizeof(PREFIX));
    secp256k1_sha256_write(&hash, seed16, 16);
    secp256k1_sha256_finalize(&hash, out32);
    for (i = 0; i < 4; ++i) {
        uint64_t s = 0;
        int j;
        for (j = 0; j < 8; ++j) s = (s << 8) | out32[8*i + j];
        secp256k1_test_state[i] = s;
    }
}